

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

LPVOID VirtualAlloc(LPVOID lpAddress,SIZE_T dwSize,DWORD flAllocationType,DWORD flProtect)

{
  BOOL BVar1;
  LPVOID pvVar2;
  Volatile<int> *pVVar3;
  
  if ((lpAddress == (LPVOID)0x0) && (lpAddress = (LPVOID)0x0, (flAllocationType & 0x3000) != 0)) {
    lpAddress = VirtualAlloc_((LPVOID)0x0,dwSize,0x2000,flProtect);
    if (lpAddress == (LPVOID)0x0) {
      return (LPVOID)0x0;
    }
    if ((short)lpAddress == 0) {
      pVVar3 = &attempt1;
    }
    else {
      VirtualFree(lpAddress,0,0x8000);
      pvVar2 = VirtualAlloc_((LPVOID)0x0,dwSize + 0x10000,0x2000,flProtect);
      if (pvVar2 == (LPVOID)0x0) {
        return (LPVOID)0x0;
      }
      lpAddress = (LPVOID)(((ulong)pvVar2 & 0xffffffffffff0000) + 0x10000);
      BVar1 = VirtualFreeEnclosing_(pvVar2,dwSize,0x10000,lpAddress);
      if (BVar1 == 0) {
        fprintf(_stderr,"] %s %s:%d","VirtualAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x7b3);
        fprintf(_stderr,"Unable to unmap the enclosing memory.\n");
        return (LPVOID)0x0;
      }
      pVVar3 = &attempt2;
    }
    LOCK();
    pVVar3->m_val = pVVar3->m_val + 1;
    UNLOCK();
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    flAllocationType = flAllocationType & 0xffffdfff;
    if (flAllocationType == 0) {
      return lpAddress;
    }
  }
  pvVar2 = VirtualAlloc_(lpAddress,dwSize,flAllocationType,flProtect);
  return pvVar2;
}

Assistant:

LPVOID
PALAPI
VirtualAlloc(
         IN LPVOID lpAddress,       /* Region to reserve or commit */
         IN SIZE_T dwSize,          /* Size of Region */
         IN DWORD flAllocationType, /* Type of allocation */
         IN DWORD flProtect)        /* Type of access protection */
{
    if (lpAddress)
    {
        return VirtualAlloc_(lpAddress, dwSize, flAllocationType, flProtect);
    }

    bool reserve = (flAllocationType & MEM_RESERVE) == MEM_RESERVE;
    bool commit  = (flAllocationType & MEM_COMMIT)  == MEM_COMMIT;

    if (reserve || commit)
    {
        char *address = (char*) VirtualAlloc_(nullptr, dwSize, MEM_RESERVE, flProtect);
        if (!address)
        {
            return nullptr;
        }

        if (reserve)
        {
            flAllocationType &= ~MEM_RESERVE;
        }

        SIZE_T diff = ((ULONG_PTR)address % KB64);
        if (diff != 0)
        {
            // Free the previously allocated address as it's not 64K aligned.
            VirtualFree(address, 0, MEM_RELEASE);

            // looks like ``pushed new address + dwSize`` is not available
            // try on a bigger surface
            address = (char*)VirtualAlloc_(nullptr, dwSize + KB64, MEM_RESERVE, flProtect);
            if (!address)
            {
                // This is an actual OOM.
                return nullptr;
            }

            diff = ((ULONG_PTR)address % KB64);
            char * addr64 = address + (KB64 - diff);

            // Free the regions enclosing the 64K aligned region we intend to use.
            if (VirtualFreeEnclosing_(address, dwSize, KB64, addr64) == 0)
            {
                ASSERT("Unable to unmap the enclosing memory.\n");
                return nullptr;
            }

            address = addr64;
#ifdef DEBUG
            InterlockedIncrement(&attempt2);
#endif
        }
#ifdef DEBUG
        else
        {
            InterlockedIncrement(&attempt1);
        }
#endif

#ifdef DEBUG
        TRACE("VirtualAlloc 64K alignment attempts: %d : %d \n", attempt1.RawValue(), attempt2.RawValue());
#endif
        if (flAllocationType == 0) return address;
        lpAddress = address;
    }

    return VirtualAlloc_(lpAddress, dwSize, flAllocationType, flProtect);
}